

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void Json::CharReaderBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value local_1a0;
  Value local_178;
  Value local_150;
  Value local_128;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_60;
  Value local_38;
  
  Value::Value(&local_38,true);
  pVVar1 = Value::operator[](settings,"collectComments");
  Value::operator=(pVVar1,&local_38);
  Value::~Value(&local_38);
  Value::Value(&local_60,true);
  pVVar1 = Value::operator[](settings,"allowComments");
  Value::operator=(pVVar1,&local_60);
  Value::~Value(&local_60);
  Value::Value(&local_88,false);
  pVVar1 = Value::operator[](settings,"strictRoot");
  Value::operator=(pVVar1,&local_88);
  Value::~Value(&local_88);
  Value::Value(&local_b0,false);
  pVVar1 = Value::operator[](settings,"allowDroppedNullPlaceholders");
  Value::operator=(pVVar1,&local_b0);
  Value::~Value(&local_b0);
  Value::Value(&local_d8,false);
  pVVar1 = Value::operator[](settings,"allowNumericKeys");
  Value::operator=(pVVar1,&local_d8);
  Value::~Value(&local_d8);
  Value::Value(&local_100,false);
  pVVar1 = Value::operator[](settings,"allowSingleQuotes");
  Value::operator=(pVVar1,&local_100);
  Value::~Value(&local_100);
  Value::Value(&local_128,1000);
  pVVar1 = Value::operator[](settings,"stackLimit");
  Value::operator=(pVVar1,&local_128);
  Value::~Value(&local_128);
  Value::Value(&local_150,false);
  pVVar1 = Value::operator[](settings,"failIfExtra");
  Value::operator=(pVVar1,&local_150);
  Value::~Value(&local_150);
  Value::Value(&local_178,false);
  pVVar1 = Value::operator[](settings,"rejectDupKeys");
  Value::operator=(pVVar1,&local_178);
  Value::~Value(&local_178);
  Value::Value(&local_1a0,false);
  pVVar1 = Value::operator[](settings,"allowSpecialFloats");
  Value::operator=(pVVar1,&local_1a0);
  Value::~Value(&local_1a0);
  return;
}

Assistant:

void CharReaderBuilder::setDefaults(Json::Value* settings)
{
//! [CharReaderBuilderDefaults]
  (*settings)["collectComments"] = true;
  (*settings)["allowComments"] = true;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = false;
  (*settings)["rejectDupKeys"] = false;
  (*settings)["allowSpecialFloats"] = false;
//! [CharReaderBuilderDefaults]
}